

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setMinimumIntegerDigits(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  int32_t max;
  int32_t newValue_local;
  DecimalFormat *this_local;
  
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  if (newValue != pDVar1->minimumIntegerDigits) {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    if ((-1 < pDVar1->maximumIntegerDigits) && (pDVar1->maximumIntegerDigits < newValue)) {
      pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      pDVar1->maximumIntegerDigits = newValue;
    }
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->minimumIntegerDigits = newValue;
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setMinimumIntegerDigits(int32_t newValue) {
    if (newValue == fields->properties->minimumIntegerDigits) { return; }
    // For backwards compatibility, conflicting min/max need to keep the most recent setting.
    int32_t max = fields->properties->maximumIntegerDigits;
    if (max >= 0 && max < newValue) {
        fields->properties->maximumIntegerDigits = newValue;
    }
    fields->properties->minimumIntegerDigits = newValue;
    touchNoError();
}